

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O0

skiwi * __thiscall skiwi::convert_string_to_wstring(skiwi *this,string *str)

{
  bool bVar1;
  utf_error uVar2;
  uint32_t local_44;
  utf_error err_code;
  uint32_t cp;
  const_iterator it_end;
  const_iterator it;
  string *str_local;
  wstring *out;
  
  std::__cxx11::wstring::wstring((wstring *)this);
  std::__cxx11::string::size();
  std::__cxx11::wstring::reserve((ulong)this);
  it_end._M_current = (char *)std::__cxx11::string::begin();
  _err_code = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=
                           (&it_end,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&err_code), bVar1) {
    local_44 = 0;
    uVar2 = utf8::internal::
            validate_next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&it_end,_err_code,&local_44);
    if (uVar2 == UTF8_OK) {
      std::__cxx11::wstring::push_back((wchar_t)this);
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator*(&it_end);
      std::__cxx11::wstring::push_back((wchar_t)this);
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&it_end);
    }
  }
  return this;
}

Assistant:

std::wstring convert_string_to_wstring(const std::string& str)
  {
  std::wstring out;
  out.reserve(str.size());
  auto it = str.begin();
  auto it_end = str.end();

  for (; it != it_end;)
    {
    uint32_t cp = 0;
    utf8::internal::utf_error err_code = utf8::internal::validate_next(it, it_end, cp);
    if (err_code == utf8::internal::UTF8_OK)
      {
      out.push_back((wchar_t)cp);
      }
    else
      {
      out.push_back(*it);
      ++it;
      }
    }
  return out;
  }